

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlap.hpp
# Opt level: O0

void __thiscall
biosoup::Overlap::Overlap
          (Overlap *this,uint32_t lhs_id,uint32_t lhs_begin,uint32_t lhs_end,uint32_t rhs_id,
          uint32_t rhs_begin,uint32_t rhs_end,uint32_t score,bool strand)

{
  bool strand_local;
  uint32_t rhs_begin_local;
  uint32_t rhs_id_local;
  uint32_t lhs_end_local;
  uint32_t lhs_begin_local;
  uint32_t lhs_id_local;
  Overlap *this_local;
  
  this->lhs_id = lhs_id;
  this->lhs_begin = lhs_begin;
  this->lhs_end = lhs_end;
  this->rhs_id = rhs_id;
  this->rhs_begin = rhs_begin;
  this->rhs_end = rhs_end;
  this->score = score;
  this->strand = strand;
  std::__cxx11::string::string((string *)&this->alignment);
  return;
}

Assistant:

Overlap(
      std::uint32_t lhs_id, std::uint32_t lhs_begin, std::uint32_t lhs_end,
      std::uint32_t rhs_id, std::uint32_t rhs_begin, std::uint32_t rhs_end,
      std::uint32_t score,
      bool strand = true)
      : lhs_id(lhs_id),
        lhs_begin(lhs_begin),
        lhs_end(lhs_end),
        rhs_id(rhs_id),
        rhs_begin(rhs_begin),
        rhs_end(rhs_end),
        score(score),
        strand(strand),
        alignment() {}